

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QSize __thiscall
QListViewPrivate::itemSize(QListViewPrivate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QPersistentModelIndex *this_00;
  int iVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  long *plVar4;
  QSize QVar5;
  QSize QVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0xffffffff00000000;
  plVar4 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->uniformItemSizes == false) {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x208))(plVar4,index);
    if (plVar4 == (long *)0x0) {
      QVar6.wd.m_i = -1;
      QVar6.ht.m_i = 0;
      goto LAB_00579f5e;
    }
    QVar6 = (QSize)(**(code **)(*plVar4 + 0x68))(plVar4,option,index);
  }
  else {
    if (((this->cachedItemSize).wd.m_i < 0) || ((this->cachedItemSize).ht.m_i < 0)) {
      pQVar2 = (this->super_QAbstractItemViewPrivate).model;
      this_00 = &(this->super_QAbstractItemViewPrivate).root;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_58,this_00);
      iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,(QModelIndex *)&local_58);
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (this->super_QAbstractItemViewPrivate).model;
      iVar1 = this->column;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_58,pQVar2,iVar3 + -1,iVar1,&local_70);
      plVar4 = (long *)(**(code **)(*plVar4 + 0x208))(plVar4,&local_58);
      if (plVar4 == (long *)0x0) {
        QVar5.wd.m_i = -1;
        QVar5.ht.m_i = -1;
      }
      else {
        QVar5 = (QSize)(**(code **)(*plVar4 + 0x68))(plVar4,option,&local_58);
      }
      this->cachedItemSize = QVar5;
    }
    QVar6 = this->cachedItemSize;
  }
  uVar7 = (ulong)QVar6 & 0xffffffff00000000;
LAB_00579f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)((ulong)QVar6 & 0xffffffff | uVar7);
  }
  __stack_chk_fail();
}

Assistant:

QSize QListViewPrivate::itemSize(const QStyleOptionViewItem &option, const QModelIndex &index) const
{
    Q_Q(const QListView);
    if (!uniformItemSizes) {
        const QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
        return delegate ? delegate->sizeHint(option, index) : QSize();
    }
    if (!cachedItemSize.isValid()) { // the last item is probably the largest, so we use its size
        int row = model->rowCount(root) - 1;
        QModelIndex sample = model->index(row, column, root);
        const QAbstractItemDelegate *delegate = q->itemDelegateForIndex(sample);
        cachedItemSize = delegate ? delegate->sizeHint(option, sample) : QSize();
    }
    return cachedItemSize;
}